

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,ValueType type)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  undefined1 local_14;
  ValueType type_local;
  Value *this_local;
  
  local_14 = (undefined1)type;
  this->field_0x8 = local_14;
  this->field_0x9 = this->field_0x9 & 0xfe;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  switch(type) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
    (this->value_).int_ = 0;
    break;
  case realValue:
    (this->value_).int_ = 0;
    break;
  case stringValue:
    (this->value_).int_ = 0;
    break;
  case booleanValue:
    (this->value_).bool_ = false;
    break;
  case arrayValue:
  case objectValue:
    this_00 = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               *)operator_new(0x30);
    memset(this_00,0,0x30);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::map(this_00);
    (this->value_).map_ = this_00;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fishiu[P]mahjong/json/../jsoncpp.cpp"
                  ,0x6a3,"Json::Value::Value(ValueType)");
  }
  return;
}

Assistant:

Value::Value(ValueType type)
    : type_(type), allocated_(false)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(0), limit_(0) {
  switch (type) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
    value_.int_ = 0;
    break;
  case realValue:
    value_.real_ = 0.0;
    break;
  case stringValue:
    value_.string_ = 0;
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues();
    break;
#else
  case arrayValue:
    value_.array_ = arrayAllocator()->newArray();
    break;
  case objectValue:
    value_.map_ = mapAllocator()->newMap();
    break;
#endif
  case booleanValue:
    value_.bool_ = false;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}